

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpAscii(Node *this,ostream *s,int indent)

{
  byte bVar1;
  pointer pNVar2;
  pointer pNVar3;
  Node *this_00;
  
  BeginAscii(this,s,indent);
  this_00 = this;
  DumpPropertiesAscii(this,s,indent);
  if ((this->force_has_children == false) &&
     (pNVar2 = (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start,
     pNVar2 == (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
    bVar1 = 0;
    pNVar3 = pNVar2;
  }
  else {
    std::operator<<(s," {");
    this_00 = this;
    DumpChildrenAscii(this,s,indent + 1);
    bVar1 = this->force_has_children;
    pNVar2 = (this->children).
             super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar3 = (this->children).
             super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  EndAscii(this_00,s,indent,(bool)(pNVar3 != pNVar2 | bVar1 & 1));
  return;
}

Assistant:

void FBX::Node::DumpAscii(std::ostream &s, int indent)
{
    // write name
    BeginAscii(s, indent);

    // write properties
    DumpPropertiesAscii(s, indent);

    if (force_has_children || !children.empty()) {
        // begin children (with a '{')
        BeginChildrenAscii(s, indent + 1);
        // write children
        DumpChildrenAscii(s, indent + 1);
    }

    // finish (also closing the children bracket '}')
    EndAscii(s, indent, force_has_children || !children.empty());
}